

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thermo.cpp
# Opt level: O0

void __thiscall
IO::Thermo::setUpperTemperatureCoefficients
          (Thermo *this,double ah1,double ah2,double ah3,double ah4,double ah5,double ah6,double ah7
          )

{
  double local_48;
  double ah7_local;
  double ah6_local;
  double ah5_local;
  double ah4_local;
  double ah3_local;
  double ah2_local;
  double ah1_local;
  Thermo *this_local;
  
  local_48 = ah7;
  ah7_local = ah6;
  ah6_local = ah5;
  ah5_local = ah4;
  ah4_local = ah3;
  ah3_local = ah2;
  ah2_local = ah1;
  ah1_local = (double)this;
  std::vector<double,_std::allocator<double>_>::clear(&this->ah_);
  std::vector<double,_std::allocator<double>_>::push_back(&this->ah_,&ah2_local);
  std::vector<double,_std::allocator<double>_>::push_back(&this->ah_,&ah3_local);
  std::vector<double,_std::allocator<double>_>::push_back(&this->ah_,&ah4_local);
  std::vector<double,_std::allocator<double>_>::push_back(&this->ah_,&ah5_local);
  std::vector<double,_std::allocator<double>_>::push_back(&this->ah_,&ah6_local);
  std::vector<double,_std::allocator<double>_>::push_back(&this->ah_,&ah7_local);
  std::vector<double,_std::allocator<double>_>::push_back(&this->ah_,&local_48);
  return;
}

Assistant:

void IO::Thermo::setUpperTemperatureCoefficients(
        double ah1, double ah2, double ah3,
        double ah4, double ah5, double ah6,
        double ah7) {
    ah_.clear();
    ah_.push_back(ah1);
    ah_.push_back(ah2);
    ah_.push_back(ah3);
    ah_.push_back(ah4);
    ah_.push_back(ah5);
    ah_.push_back(ah6);
    ah_.push_back(ah7);
}